

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

bool __thiscall minja::Value::to_bool(Value *this)

{
  value_t vVar1;
  bool bVar2;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar2 = is_null(this);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    vVar1 = (this->primitive_).m_data.m_type;
    if (vVar1 == boolean) {
      bVar2 = get<bool>(this);
      return bVar2;
    }
    if ((byte)(vVar1 - number_integer) < 3) {
      dVar3 = get<double>(this);
      bVar2 = (bool)(-(dVar3 != 0.0) & 1);
    }
    else if (vVar1 == string) {
      get<std::__cxx11::string>(&local_30,this);
      bVar2 = local_30._M_string_length != 0;
      std::__cxx11::string::~string((string *)&local_30);
    }
    else if ((this->array_).
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = empty(this);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool to_bool() const {
    if (is_null()) return false;
    if (is_boolean()) return get<bool>();
    if (is_number()) return get<double>() != 0;
    if (is_string()) return !get<std::string>().empty();
    if (is_array()) return !empty();
    return true;
  }